

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O3

void __thiscall test_app::test_buffer_size(test_app *this,bool async)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  ostream *poVar7;
  ostream *poVar8;
  undefined7 in_register_00000031;
  char *pcVar9;
  ulong uVar10;
  string result_1;
  string result_2;
  string result;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar10 = CONCAT71(in_register_00000031,async) & 0xffffffff;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Test setbuf/flush ",0x14);
  pcVar9 = "sync";
  iVar5 = (int)CONCAT71(in_register_00000031,async);
  if (iVar5 != 0) {
    pcVar9 = "async";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,uVar10 | 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  set_context(this,true,true);
  uVar6 = cppcms::application::response();
  cppcms::http::response::io_mode(uVar6,iVar5 * 2 + 1);
  bVar4 = (bool)cppcms::application::response();
  cppcms::http::response::full_asynchronous_buffering(bVar4);
  cppcms::application::response();
  cppcms::http::response::out();
  std::ostream::flush();
  iVar5 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar5);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
  paVar1 = &local_d0.field_2;
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[x]","");
  compare_strings(&local_d0,&local_b0,0x7e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar8 = (ostream *)cppcms::http::response::out();
  std::ostream::operator<<(poVar8,0x7b);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  remove_brakets(&local_d0,&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[123]","");
  remove_brakets(&local_70,&local_90);
  compare_strings(&local_d0,&local_70,0x80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar5 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar5);
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"abcdefg",7);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[abcdefg]","");
  compare_strings(&local_d0,&local_b0,0x83);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar8 = (ostream *)cppcms::http::response::out();
  std::ostream::operator<<(poVar8,0x7c);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  compare_strings(&local_d0,&local_b0,0x85);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  cppcms::http::response::out();
  std::ostream::flush();
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[124]","");
  compare_strings(&local_d0,&local_b0,0x87);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  local_d0._M_dataplus._M_p._0_1_ = 0x30;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_d0,1);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  compare_strings(&local_d0,&local_b0,0x89);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  local_d0._M_dataplus._M_p._0_1_ = 0x31;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_d0,1);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  compare_strings(&local_d0,&local_b0,0x8b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  local_d0._M_dataplus._M_p._0_1_ = 0x32;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_d0,1);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  compare_strings(&local_d0,&local_b0,0x8d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  local_d0._M_dataplus._M_p._0_1_ = 0x33;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_d0,1);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  compare_strings(&local_d0,&local_b0,0x8f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  local_d0._M_dataplus._M_p._0_1_ = 0x34;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_d0,1);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[01234]","");
  compare_strings(&local_d0,&local_b0,0x91);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"xxx",3);
  iVar5 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar5);
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[xxx]","");
  compare_strings(&local_d0,&local_b0,0x94);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((char)uVar10 != '\0') {
    iVar5 = cppcms::application::response();
    cppcms::http::response::setbuf(iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-- fully/partially buffered mode",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    bVar4 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar4);
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"12345678",8);
    pcVar3 = (this->output_)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
    (this->output_)._M_string_length = 0;
    *(this->output_)._M_dataplus._M_p = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    compare_strings(&local_d0,&local_b0,0x9a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
    pcVar3 = (this->output_)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
    (this->output_)._M_string_length = 0;
    *(this->output_)._M_dataplus._M_p = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    compare_strings(&local_d0,&local_b0,0x9c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    bVar4 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar4);
    pcVar3 = (this->output_)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
    (this->output_)._M_string_length = 0;
    *(this->output_)._M_dataplus._M_p = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[12345678]","");
    compare_strings(&local_d0,&local_b0,0x9e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    bVar4 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar4);
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"123",3);
    pcVar3 = (this->output_)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
    (this->output_)._M_string_length = 0;
    *(this->output_)._M_dataplus._M_p = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    compare_strings(&local_d0,&local_b0,0xa1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    bVar4 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar4);
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
    pcVar3 = (this->output_)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
    (this->output_)._M_string_length = 0;
    *(this->output_)._M_dataplus._M_p = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[123]","");
    compare_strings(&local_d0,&local_b0,0xa4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  cppcms::application::response();
  cppcms::http::response::finalize();
  pcVar3 = (this->output_)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->output_)._M_string_length);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[EOF]","");
  compare_strings(&local_d0,&local_b0,0xa7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void test_buffer_size(bool async)
	{
		std::cout << "- Test setbuf/flush " << (async ? "async" : "sync")<< std::endl;
		set_context(true,true);
		if(async) {
			response().io_mode(cppcms::http::response::asynchronous);
		}
		else {
			response().io_mode(cppcms::http::response::nogzip);
		}
		response().full_asynchronous_buffering(false);
		response().out() << std::flush;
		response().setbuf(0);
		str();
		response().out() << "x";
		TEQ(str(),"[x]");
		response().out() << 123;
		TEQC(str(),"[123]");
		response().setbuf(4);
		response().out() << "abcdefg";
		TEQ(str(),"[abcdefg]");
		response().out() << 124;
		TEQ(str(),"");
		response().out() << std::flush;
		TEQ(str(),"[124]");
		response().out() << '0';
		TEQ(str(),"");
		response().out() << '1';
		TEQ(str(),"");
		response().out() << '2';
		TEQ(str(),"");
		response().out() << '3';
		TEQ(str(),"");
		response().out() << '4';
		TEQ(str(),"[01234]");
		response().out() << "xxx";
		response().setbuf(0);
		TEQ(str(),"[xxx]");
		if(async) {
			response().setbuf(4);
			std::cout<< "-- fully/partially buffered mode" << std::endl;
			response().full_asynchronous_buffering(true);
			response().out() << "12345678";
			TEQ(str(),"");
			response().out() << std::flush;
			TEQ(str(),"");
			response().full_asynchronous_buffering(false);
			TEQ(str(),"[12345678]");
			response().full_asynchronous_buffering(true);
			response().out() << "123";
			TEQ(str(),"");
			response().full_asynchronous_buffering(false);
			response().out() << std::flush;
			TEQ(str(),"[123]");
		}
		response().finalize();
		TEQ(str(),"[EOF]");
	}